

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O0

shared_ptr<chaiscript::dispatch::Proxy_Function_Base> __thiscall
chaiscript::
make_shared<chaiscript::dispatch::Proxy_Function_Base,chaiscript::dispatch::Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value(*)(chaiscript::Function_Params_const&)>,chaiscript::Boxed_Value(*)(chaiscript::Function_Params_const&)>
          (chaiscript *this,_func_Boxed_Value_Function_Params_ptr **arg)

{
  _func_Boxed_Value_Function_Params_ptr *t_f;
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
  *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> sVar1;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> local_70;
  Param_Types local_60;
  unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_> local_30;
  shared_ptr<chaiscript::AST_Node> local_28;
  _func_Boxed_Value_Function_Params_ptr **local_18;
  _func_Boxed_Value_Function_Params_ptr **arg_local;
  
  local_18 = arg;
  arg_local = (_func_Boxed_Value_Function_Params_ptr **)this;
  this_00 = (Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>
             *)operator_new(0x70);
  t_f = *local_18;
  std::unique_ptr<chaiscript::AST_Node,std::default_delete<chaiscript::AST_Node>>::
  unique_ptr<std::default_delete<chaiscript::AST_Node>,void>
            ((unique_ptr<chaiscript::AST_Node,std::default_delete<chaiscript::AST_Node>> *)&local_30
            );
  std::shared_ptr<chaiscript::AST_Node>::
  shared_ptr<chaiscript::AST_Node,std::default_delete<chaiscript::AST_Node>,void>
            (&local_28,&local_30);
  dispatch::Param_Types::Param_Types(&local_60);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::shared_ptr(&local_70);
  dispatch::
  Dynamic_Proxy_Function_Impl<chaiscript::Boxed_Value_(*)(const_chaiscript::Function_Params_&)>::
  Dynamic_Proxy_Function_Impl(this_00,t_f,-1,&local_28,&local_60,&local_70);
  std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base,void>
            ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)this,
             (Proxy_Function_Base *)this_00);
  Catch::clara::std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr(&local_70);
  dispatch::Param_Types::~Param_Types(&local_60);
  Catch::clara::std::shared_ptr<chaiscript::AST_Node>::~shared_ptr(&local_28);
  Catch::clara::std::unique_ptr<chaiscript::AST_Node,_std::default_delete<chaiscript::AST_Node>_>::
  ~unique_ptr(&local_30);
  sVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<chaiscript::dispatch::Proxy_Function_Base>)
         sVar1.
         super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline std::shared_ptr<B> make_shared(Arg &&...arg) {
#ifdef CHAISCRIPT_USE_STD_MAKE_SHARED
    return std::make_shared<D>(std::forward<Arg>(arg)...);
#else
    return std::shared_ptr<B>(static_cast<B *>(new D(std::forward<Arg>(arg)...)));
#endif
  }